

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::generateIterations
          (TextureGatherCubeCase *this)

{
  int *piVar1;
  GatherType gatherType;
  ChannelOrder CVar2;
  pointer pIVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  uint uVar9;
  pointer pGVar10;
  ulong uVar11;
  int cubeFaceI;
  CubeFace CVar12;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  basicIterations;
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  local_70;
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)&stack0xffffffffffffffa8);
  generateBasic2DCaseIterations
            (&local_70,gatherType,
             (TextureFormat *)(ulong)(this->super_TextureGatherCase).m_textureFormat.order,
             (IVec2 *)&stack0xffffffffffffffa8);
  uVar9 = (int)((long)local_70.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_70.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x38e38e39;
  CVar12 = CUBEFACE_NEGATIVE_X;
  do {
    if (CVar12 == CUBEFACE_NEGATIVE_X) {
      uVar11 = (ulong)(uVar9 & 0x7fffffff);
      pGVar10 = local_70.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)uVar9) {
        do {
          local_34 = 0;
          local_58 = 0xffffffff;
          local_44 = 0;
          uStack_3c = 0;
          local_54 = 0;
          uStack_4c = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ::push_back(&this->m_iterations,(value_type *)&stack0xffffffffffffffa8);
          pIVar3 = (this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pIVar3[-1].gatherArgs.offsets[3].m_data[1] = pGVar10->offsets[3].m_data[1];
          iVar4 = pGVar10->componentNdx;
          iVar5 = pGVar10->offsets[0].m_data[0];
          iVar6 = pGVar10->offsets[0].m_data[1];
          iVar7 = pGVar10->offsets[1].m_data[0];
          uVar8 = *(undefined8 *)(pGVar10->offsets[2].m_data + 1);
          *(undefined8 *)(pIVar3[-1].gatherArgs.offsets[1].m_data + 1) =
               *(undefined8 *)(pGVar10->offsets[1].m_data + 1);
          *(undefined8 *)(pIVar3[-1].gatherArgs.offsets[2].m_data + 1) = uVar8;
          pIVar3[-1].gatherArgs.componentNdx = iVar4;
          pIVar3[-1].gatherArgs.offsets[0].m_data[0] = iVar5;
          pIVar3[-1].gatherArgs.offsets[0].m_data[1] = iVar6;
          pIVar3[-1].gatherArgs.offsets[1].m_data[0] = iVar7;
          (this->m_iterations).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].face = CUBEFACE_NEGATIVE_X;
          uVar11 = uVar11 - 1;
          pGVar10 = pGVar10 + 1;
        } while (uVar11 != 0);
      }
    }
    else if (0 < (int)uVar9) {
      CVar2 = (this->super_TextureGatherCase).m_textureFormat.order;
      uVar11 = 0;
      pGVar10 = local_70.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (((CVar2 == D) || (CVar2 == DS)) ||
           (pGVar10->componentNdx == (CVar12 & CUBEFACE_POSITIVE_Y))) {
          local_34 = 0;
          local_58 = 0xffffffff;
          local_44 = 0;
          uStack_3c = 0;
          local_54 = 0;
          uStack_4c = 0;
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ::push_back(&this->m_iterations,(value_type *)&stack0xffffffffffffffa8);
          uVar11 = uVar11 & 0xffffffff;
          pIVar3 = (this->m_iterations).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pIVar3[-1].gatherArgs.offsets[3].m_data[1] =
               local_70.
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11].offsets[3].m_data[1];
          pGVar10 = local_70.
                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar11;
          iVar4 = pGVar10->componentNdx;
          iVar5 = pGVar10->offsets[0].m_data[0];
          iVar6 = pGVar10->offsets[0].m_data[1];
          iVar7 = pGVar10->offsets[1].m_data[0];
          piVar1 = local_70.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].offsets[1].m_data + 1;
          uVar8 = *(undefined8 *)(piVar1 + 2);
          *(undefined8 *)(pIVar3[-1].gatherArgs.offsets[1].m_data + 1) = *(undefined8 *)piVar1;
          *(undefined8 *)(pIVar3[-1].gatherArgs.offsets[2].m_data + 1) = uVar8;
          pIVar3[-1].gatherArgs.componentNdx = iVar4;
          pIVar3[-1].gatherArgs.offsets[0].m_data[0] = iVar5;
          pIVar3[-1].gatherArgs.offsets[0].m_data[1] = iVar6;
          pIVar3[-1].gatherArgs.offsets[1].m_data[0] = iVar7;
          (this->m_iterations).
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCubeCase::Iteration>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].face = CVar12;
          break;
        }
        uVar11 = uVar11 + 1;
        pGVar10 = pGVar10 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar11);
    }
    CVar12 = CVar12 + CUBEFACE_POSITIVE_X;
    if (CVar12 == CUBEFACE_LAST) {
      if (local_70.
          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return;
      }
      operator_delete(local_70.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_70.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return;
    }
  } while( true );
}

Assistant:

void TextureGatherCubeCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());

	const vector<GatherArgs> basicIterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());

	for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
	{
		const tcu::CubeFace cubeFace = (tcu::CubeFace)cubeFaceI;

		// Don't duplicate all cases for all faces.
		if (cubeFaceI == 0)
		{
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				m_iterations.push_back(Iteration());
				m_iterations.back().gatherArgs = basicIterations[basicNdx];
				m_iterations.back().face = cubeFace;
			}
		}
		else
		{
			// For other faces than first, only test one component per face.
			for (int basicNdx = 0; basicNdx < (int)basicIterations.size(); basicNdx++)
			{
				if (isDepthFormat(m_textureFormat) || basicIterations[basicNdx].componentNdx == cubeFaceI % 4)
				{
					m_iterations.push_back(Iteration());
					m_iterations.back().gatherArgs = basicIterations[basicNdx];
					m_iterations.back().face = cubeFace;
					break;
				}
			}
		}
	}
}